

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigTable.c
# Opt level: O0

void Fraig_TablePrintStatsF(Fraig_Man_t *pMan)

{
  Fraig_HashTable_t *pFVar1;
  uint local_28;
  int local_24;
  int Counter;
  int i;
  Fraig_Node_t *pNode;
  Fraig_HashTable_t *pT;
  Fraig_Man_t *pMan_local;
  
  pFVar1 = pMan->pTableF;
  printf("Functional table. Table size = %d. Number of entries = %d.\n",(ulong)(uint)pFVar1->nBins,
         (ulong)(uint)pFVar1->nEntries);
  for (local_24 = 0; local_24 < pFVar1->nBins; local_24 = local_24 + 1) {
    local_28 = 0;
    for (_Counter = pFVar1->pBins[local_24]; _Counter != (Fraig_Node_t *)0x0;
        _Counter = _Counter->pNextF) {
      local_28 = local_28 + 1;
    }
    if (1 < (int)local_28) {
      printf("{%d} ",(ulong)local_28);
    }
  }
  printf("\n");
  return;
}

Assistant:

void Fraig_TablePrintStatsF( Fraig_Man_t * pMan )
{
    Fraig_HashTable_t * pT = pMan->pTableF;
    Fraig_Node_t * pNode;
    int i, Counter;

    printf( "Functional table. Table size = %d. Number of entries = %d.\n", pT->nBins, pT->nEntries );
    for ( i = 0; i < pT->nBins; i++ )
    {
        Counter = 0;
        Fraig_TableBinForEachEntryF( pT->pBins[i], pNode )
            Counter++;
        if ( Counter > 1 )
            printf( "{%d} ", Counter );
    }
    printf( "\n" );
}